

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3StrAccumEnlarge(StrAccum *p,i64 N)

{
  int iVar1;
  StrAccum *p_00;
  void *__dest;
  void *in_RSI;
  long *in_RDI;
  i64 szNew;
  char *zOld;
  char *zNew;
  undefined8 in_stack_ffffffffffffffc8;
  sqlite3 *db;
  StrAccum *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*(char *)((long)in_RDI + 0x1c) == '\0') {
    if (*(int *)((long)in_RDI + 0x14) == 0) {
      sqlite3StrAccumSetError
                (in_stack_ffffffffffffffd0,(u8)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
      local_4 = ((int)in_RDI[2] - (int)in_RDI[3]) + -1;
    }
    else {
      if ((*(byte *)((long)in_RDI + 0x1d) & 4) == 0) {
        db = (sqlite3 *)0x0;
      }
      else {
        db = (sqlite3 *)in_RDI[1];
      }
      p_00 = (StrAccum *)((long)in_RSI + (ulong)*(uint *)(in_RDI + 3) + 1);
      if ((long)((long)&p_00->db + (ulong)*(uint *)(in_RDI + 3)) <=
          (long)(ulong)*(uint *)((long)in_RDI + 0x14)) {
        p_00 = (StrAccum *)((long)&p_00->db + (ulong)*(uint *)(in_RDI + 3));
      }
      if ((long)(ulong)*(uint *)((long)in_RDI + 0x14) < (long)p_00) {
        sqlite3_str_reset((StrAccum *)0x13713d);
        sqlite3StrAccumSetError(p_00,(u8)((ulong)db >> 0x38));
        local_4 = 0;
      }
      else {
        *(int *)(in_RDI + 2) = (int)p_00;
        if (*in_RDI == 0) {
          __dest = sqlite3Realloc(in_RSI,0xaaaaaaaaaaaaaaaa);
          local_4 = (int)in_RSI;
        }
        else {
          __dest = sqlite3DbRealloc(db,p_00,(u64)db);
          local_4 = (int)in_RSI;
        }
        if (__dest == (void *)0x0) {
          sqlite3_str_reset((StrAccum *)0x137235);
          sqlite3StrAccumSetError(p_00,(u8)((ulong)db >> 0x38));
          local_4 = 0;
        }
        else {
          if (((*(byte *)((long)in_RDI + 0x1d) & 4) == 0) && ((int)in_RDI[3] != 0)) {
            memcpy(__dest,(void *)in_RDI[1],(ulong)*(uint *)(in_RDI + 3));
          }
          in_RDI[1] = (long)__dest;
          iVar1 = sqlite3DbMallocSize(db,(void *)0x137210);
          *(int *)(in_RDI + 2) = iVar1;
          *(byte *)((long)in_RDI + 0x1d) = *(byte *)((long)in_RDI + 0x1d) | 4;
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3StrAccumEnlarge(StrAccum *p, i64 N){
  char *zNew;
  assert( p->nChar+N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==SQLITE_TOOBIG);
    testcase(p->accError==SQLITE_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
    return p->nAlloc - p->nChar - 1;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar + N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3Realloc(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_NOMEM);
      return 0;
    }
  }
  assert( N>=0 && N<=0x7fffffff );
  return (int)N;
}